

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O3

void __thiscall seq_precede_inc::seq_precede_inc(seq_precede_inc *this,vec<IntVar_*> *_xs)

{
  size_t __size;
  uint uVar1;
  IntVar *pIVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  vec<TrailElem> *pvVar6;
  char cVar7;
  Tint *pTVar8;
  Tint *pTVar9;
  ulong uVar10;
  int *pt_3;
  seq_precede_inc *psVar11;
  long *plVar12;
  uint uVar13;
  uint uVar14;
  int *pt_2;
  int iVar15;
  int *pt;
  vec<TrailElem> *pvVar16;
  int *pt_1;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  TrailElem local_78;
  seq_precede_inc *local_68;
  vec<Tint> *local_60;
  ulong local_58;
  vec<Tint> *local_50;
  vec<TrailElem> *local_48;
  Tint *local_40;
  vec<TrailElem> *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_78.pt = (int *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_78);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_0020cc30;
  vec<IntVar*>::vec<IntVar*>((vec<IntVar*> *)&this->xs,_xs);
  uVar14 = (this->xs).sz;
  local_58 = (ulong)uVar14;
  uVar13 = uVar14 + 1;
  (this->first).sz = uVar13;
  (this->first).cap = uVar13;
  if (uVar13 == 0) {
    local_60 = &this->limit;
    *(undefined1 (*) [16])&(this->first).data = (undefined1  [16])0x0;
    (this->limit).data = (Tint *)0x0;
    (this->first_val).sz = uVar14;
    (this->first_val).cap = uVar14;
    pTVar8 = (Tint *)0x0;
  }
  else {
    uVar10 = (ulong)uVar13;
    pTVar8 = (Tint *)calloc(1,uVar10 * 4);
    (this->first).data = pTVar8;
    local_60 = &this->limit;
    (this->limit).sz = uVar13;
    (this->limit).cap = uVar13;
    pTVar9 = (Tint *)malloc(uVar10 * 4);
    (this->limit).data = pTVar9;
    auVar5 = _DAT_001d4970;
    lVar17 = uVar10 - 1;
    auVar19._8_4_ = (int)lVar17;
    auVar19._0_8_ = lVar17;
    auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar19 = auVar19 ^ _DAT_001d4970;
    auVar24 = _DAT_001d8190;
    auVar21 = _DAT_001d4960;
    do {
      auVar23 = auVar21 ^ auVar5;
      iVar15 = auVar19._4_4_;
      uVar14 = (uint)local_58;
      if ((bool)(~(auVar23._4_4_ == iVar15 && auVar19._0_4_ < auVar23._0_4_ ||
                  iVar15 < auVar23._4_4_) & 1)) {
        *(uint *)((long)&pTVar9->v + uVar18) = uVar14;
      }
      if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
          auVar23._12_4_ <= auVar19._12_4_) {
        *(uint *)((long)&pTVar9[1].v + uVar18) = uVar14;
      }
      auVar23 = auVar24 ^ auVar5;
      iVar25 = auVar23._4_4_;
      if (iVar25 <= iVar15 && (iVar25 != iVar15 || auVar23._0_4_ <= auVar19._0_4_)) {
        *(uint *)((long)&pTVar9[2].v + uVar18) = uVar14;
        *(uint *)((long)&pTVar9[3].v + uVar18) = uVar14;
      }
      lVar17 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar17 + 4;
      lVar17 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar17 + 4;
      uVar18 = uVar18 + 0x10;
    } while ((uVar10 * 4 + 0xc & 0xfffffffffffffff0) != uVar18);
    local_50 = &this->first_val;
    (this->first_val).sz = uVar14;
    (this->first_val).cap = uVar14;
    if (uVar14 == 0) {
      *(undefined1 (*) [16])&(this->first_val).data = (undefined1  [16])0x0;
      (this->limit_val).data = (Tint *)0x0;
      uVar18 = local_58;
      goto LAB_0016e735;
    }
  }
  uVar18 = local_58;
  local_50 = &this->first_val;
  __size = local_58 * 4;
  pTVar9 = (Tint *)calloc(1,__size);
  (this->first_val).data = pTVar9;
  uVar14 = (uint)uVar18;
  (this->limit_val).sz = uVar14;
  (this->limit_val).cap = uVar14;
  pTVar9 = (Tint *)malloc(__size);
  (this->limit_val).data = pTVar9;
  auVar5 = _DAT_001d4970;
  lVar17 = uVar18 - 1;
  auVar20._8_4_ = (int)lVar17;
  auVar20._0_8_ = lVar17;
  auVar20._12_4_ = (int)((ulong)lVar17 >> 0x20);
  uVar10 = 0;
  auVar20 = auVar20 ^ _DAT_001d4970;
  auVar23 = _DAT_001d8190;
  auVar22 = _DAT_001d4960;
  do {
    auVar24 = auVar22 ^ auVar5;
    iVar15 = auVar20._4_4_;
    if ((bool)(~(auVar24._4_4_ == iVar15 && auVar20._0_4_ < auVar24._0_4_ || iVar15 < auVar24._4_4_)
              & 1)) {
      pTVar9[uVar10].v = uVar14;
    }
    if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
        auVar24._12_4_ <= auVar20._12_4_) {
      pTVar9[uVar10 + 1].v = uVar14;
    }
    auVar24 = auVar23 ^ auVar5;
    iVar25 = auVar24._4_4_;
    if (iVar25 <= iVar15 && (iVar25 != iVar15 || auVar24._0_4_ <= auVar20._0_4_)) {
      pTVar9[uVar10 + 2].v = uVar14;
      pTVar9[uVar10 + 3].v = uVar14;
    }
    uVar10 = uVar10 + 4;
    lVar17 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 4;
    auVar22._8_8_ = lVar17 + 4;
    lVar17 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar17 + 4;
  } while ((uVar18 + 3 & 0xfffffffffffffffc) != uVar10);
LAB_0016e735:
  pTVar9 = &this->max_val;
  (this->max_val).v = (int)uVar18;
  *(undefined1 (*) [16])&this->max_def = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->first_change).data + 4) = (undefined1  [16])0x0;
  *(undefined4 *)((long)&(this->limit_change).data + 4) = 0;
  (this->super_Propagator).priority = 3;
  local_78.x = pTVar8->v;
  local_78.sz = 4;
  local_78.pt = &pTVar8->v;
  vec<TrailElem>::push(&engine.trail,&local_78);
  uVar18 = local_58;
  pTVar8->v = -1;
  uVar14 = (this->xs).sz;
  pTVar8 = local_60->data;
  local_78.x = pTVar8->v;
  local_78.sz = 4;
  local_78.pt = &pTVar8->v;
  local_68 = this;
  vec<TrailElem>::push(&engine.trail,&local_78);
  pTVar8->v = uVar14 + 1;
  if ((int)uVar18 < 1) {
    local_78.x = pTVar9->v;
    local_78.sz = 4;
    local_78.pt = &pTVar9->v;
    vec<TrailElem>::push(&engine.trail,&local_78);
    pTVar9->v = 0;
    uVar14 = 0;
    psVar11 = local_68;
  }
  else {
    local_48 = &engine.trail;
    uVar14 = 1;
    iVar15 = 0;
    lVar17 = 0;
    psVar11 = local_68;
    local_40 = pTVar9;
    do {
      plVar12 = *(long **)((long)(psVar11->xs).data + lVar17 * 2);
      iVar25 = (int)plVar12[2];
      if ((int)uVar14 < iVar25) {
        cVar7 = (**(code **)(*plVar12 + 0x78))(plVar12,(long)(int)uVar14,0,1);
        if (cVar7 == '\0') goto LAB_0016ead0;
        plVar12 = *(long **)((long)(psVar11->xs).data + lVar17 * 2);
        iVar25 = (int)plVar12[2];
      }
      pvVar6 = local_48;
      if (((*(int *)((long)plVar12 + 0xc) <= (int)uVar14) && ((int)uVar14 <= iVar25)) &&
         ((plVar12[5] == 0 || (*(char *)(plVar12[5] + (long)(int)uVar14) != '\0')))) {
        pTVar8 = (psVar11->first).data + uVar14;
        local_78.x = pTVar8->v;
        local_78.sz = 4;
        local_78.pt = &pTVar8->v;
        vec<TrailElem>::push(local_48,&local_78);
        psVar11 = local_68;
        pTVar8->v = iVar15;
        pTVar8 = local_50->data;
        local_78.pt = (int *)((long)&pTVar8->v + lVar17);
        local_78.x = *(int *)((long)&pTVar8->v + lVar17);
        local_78.sz = 4;
        vec<TrailElem>::push(pvVar6,&local_78);
        *(uint *)((long)&pTVar8->v + lVar17) = uVar14;
        uVar14 = uVar14 + 1;
        plVar12 = *(long **)((long)(psVar11->xs).data + lVar17 * 2);
      }
      (**(code **)(*plVar12 + 0x38))(plVar12,psVar11,iVar15,1);
      pTVar8 = local_40;
      lVar17 = lVar17 + 4;
      iVar15 = iVar15 + 1;
    } while (uVar18 * 4 - lVar17 != 0);
    local_78.pt = &local_40->v;
    local_78.x = local_40->v;
    local_78.sz = 4;
    local_38 = &engine.trail;
    vec<TrailElem>::push(&engine.trail,&local_78);
    pvVar6 = local_38;
    pTVar8->v = uVar14 - 1;
    if ((int)local_58 < 1) {
      uVar14 = 0;
    }
    else {
      uVar18 = local_58 + 1;
      uVar13 = 0;
      uVar14 = 0;
      lVar17 = local_58 * 4;
      do {
        pIVar2 = (psVar11->xs).data[uVar18 - 2];
        uVar1 = (pIVar2->min).v;
        uVar3 = uVar14;
        if ((int)uVar14 < (int)uVar1) {
          uVar3 = uVar1;
        }
        uVar4 = uVar13;
        if ((int)uVar13 < (int)uVar1) {
          uVar4 = uVar1;
          uVar14 = uVar3;
        }
        pvVar16 = (vec<TrailElem> *)(ulong)uVar4;
        uVar13 = 0;
        if (((uVar4 != 0) && (uVar13 = uVar4, (int)uVar4 <= (pIVar2->max).v)) &&
           ((pIVar2->vals == (Tchar *)0x0 || (pIVar2->vals[(long)pvVar16].v != '\0')))) {
          local_58 = uVar18 - 2;
          pTVar8 = local_60->data + (long)pvVar16;
          local_78.x = pTVar8->v;
          local_78.sz = 4;
          local_78.pt = &pTVar8->v;
          local_48 = pvVar16;
          vec<TrailElem>::push(pvVar6,&local_78);
          pTVar8->v = (int)uVar18 + -2;
          pTVar8 = (local_68->limit_val).data;
          local_78.pt = (int *)((long)&pTVar8[-1].v + lVar17);
          local_78.x = pTVar8[uVar18 - 2].v;
          local_78.sz = 4;
          vec<TrailElem>::push(pvVar6,&local_78);
          psVar11 = local_68;
          pTVar8[uVar18 - 2].v = uVar4;
          if (((local_58 == (uint)(local_68->first).data[(long)local_48].v) &&
              (pIVar2 = (local_68->xs).data[uVar18 - 2], (pIVar2->min).v < (int)uVar4)) &&
             (iVar15 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])
                                 (pIVar2,local_48,0,1), (char)iVar15 == '\0')) {
LAB_0016ead0:
            puts("=====UNSATISFIABLE=====");
            printf("%% Top level failure!\n");
            exit(0);
          }
          uVar13 = uVar4 - 1;
        }
        uVar18 = uVar18 - 1;
        lVar17 = lVar17 + -4;
      } while (1 < uVar18);
    }
  }
  pTVar8 = &psVar11->max_def;
  local_78.x = pTVar8->v;
  local_78.sz = 4;
  local_78.pt = &pTVar8->v;
  vec<TrailElem>::push(&engine.trail,&local_78);
  pTVar8->v = uVar14;
  return;
}

Assistant:

seq_precede_inc(vec<IntVar*>& _xs)
			: xs(_xs),
				first(xs.size() + 1, 0),
				limit(xs.size() + 1, xs.size()),
				first_val(xs.size(), 0),
				limit_val(xs.size(), xs.size()),
				max_val(xs.size()),
				max_def(0) {
		const int sz = xs.size();
		priority = 3;

		// Set unused zero value out of range
		first[0] = -1;
		limit[0] = xs.size() + 1;

		int M = 1;
		// Initialize firsts.
		for (int ii = 0; ii < sz; ii++) {
			if (xs[ii]->setMaxNotR(M)) {
				if (!xs[ii]->setMax(M)) {
					TL_FAIL();
				}
			}
			if (xs[ii]->indomain(M)) {
				first[M] = ii;
				first_val[ii] = M;
				++M;
			}
			xs[ii]->attach(this, ii, EVENT_C);
		}
		max_val = M - 1;

		// check_firsts();

		// Initialize lasts.
		int m = 0;
		int k = 0;
		for (int ii = sz - 1; ii >= 0; --ii) {
			const int mx = xs[ii]->getMin();
			if (mx > k) {
				k = mx;
				if (mx > m) {
					m = mx;
				}
			}
			if ((k != 0) && xs[ii]->indomain(k)) {
				limit[k] = ii;
				limit_val[ii] = k;
				// Definite occurrence
				if (first[k] == ii && xs[ii]->setMinNotR(k)) {
					if (!xs[ii]->setMin(k)) {
						TL_FAIL();
					}
				}
				--k;
			}
		}
		max_def = m;
	}